

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O1

void __thiscall
duckdb::BufferPool::BufferPool
          (BufferPool *this,idx_t maximum_memory,bool track_eviction_timestamps,
          idx_t allocator_bulk_deallocation_flush_threshold)

{
  _Head_base<0UL,_duckdb::EvictionQueue_*,_false> _Var1;
  BufferPool *pBVar2;
  _Head_base<0UL,_duckdb::TemporaryMemoryManager_*,_false> this_00;
  EvictionQueue *pEVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  _Head_base<0UL,_duckdb::EvictionQueue_*,_false> local_40;
  BufferPool *local_38;
  
  this->_vptr_BufferPool = (_func_int **)&PTR__BufferPool_019aab08;
  (this->eviction_queue_sizes)._M_elems[0] = 1;
  (this->eviction_queue_sizes)._M_elems[1] = 6;
  (this->eviction_queue_sizes)._M_elems[2] = 1;
  (this->limit_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->limit_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->limit_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->limit_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->limit_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->maximum_memory).super___atomic_base<unsigned_long>._M_i = maximum_memory;
  (this->allocator_bulk_deallocation_flush_threshold).super___atomic_base<unsigned_long>._M_i =
       allocator_bulk_deallocation_flush_threshold;
  this->track_eviction_timestamps = track_eviction_timestamps;
  (this->queues).
  super_vector<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->queues).
  super_vector<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->queues).
  super_vector<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = this;
  this_00._M_head_impl = (TemporaryMemoryManager *)operator_new(0x98);
  TemporaryMemoryManager::TemporaryMemoryManager(this_00._M_head_impl);
  pBVar2 = local_38;
  (local_38->temporary_memory_manager).
  super_unique_ptr<duckdb::TemporaryMemoryManager,_std::default_delete<duckdb::TemporaryMemoryManager>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::TemporaryMemoryManager,_std::default_delete<duckdb::TemporaryMemoryManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TemporaryMemoryManager_*,_std::default_delete<duckdb::TemporaryMemoryManager>_>
  .super__Head_base<0UL,_duckdb::TemporaryMemoryManager_*,_false>._M_head_impl =
       this_00._M_head_impl;
  MemoryUsage::MemoryUsage(&local_38->memory_usage);
  lVar4 = 0;
  do {
    lVar5 = lVar4 + 1;
    if ((pBVar2->eviction_queue_sizes)._M_elems[lVar4] != 0) {
      uVar6 = 0;
      do {
        pEVar3 = (EvictionQueue *)operator_new(0x2c0);
        pEVar3->file_buffer_type = (FileBufferType)lVar5;
        duckdb_moodycamel::
        ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
        ::ConcurrentQueue(&pEVar3->q,0xc0);
        (pEVar3->purge_nodes).
        super_vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>.
        super__Vector_base<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pEVar3->purge_nodes).
        super_vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>.
        super__Vector_base<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pEVar3->purge_lock).super___mutex_base._M_mutex.__data.__list.__next =
             (__pthread_internal_list *)0x0;
        (pEVar3->purge_nodes).
        super_vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>.
        super__Vector_base<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(undefined8 *)((long)&(pEVar3->purge_lock).super___mutex_base._M_mutex + 0x10) = 0;
        (pEVar3->purge_lock).super___mutex_base._M_mutex.__data.__list.__prev =
             (__pthread_internal_list *)0x0;
        (pEVar3->purge_lock).super___mutex_base._M_mutex.__align = 0;
        *(undefined8 *)((long)&(pEVar3->purge_lock).super___mutex_base._M_mutex + 8) = 0;
        (pEVar3->evict_queue_insertions).super___atomic_base<unsigned_long>._M_i = 0;
        (pEVar3->total_dead_nodes).super___atomic_base<unsigned_long>._M_i = 0;
        local_40._M_head_impl = pEVar3;
        ::std::
        vector<duckdb::unique_ptr<duckdb::EvictionQueue,std::default_delete<duckdb::EvictionQueue>,true>,std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,std::default_delete<duckdb::EvictionQueue>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::EvictionQueue,std::default_delete<duckdb::EvictionQueue>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::EvictionQueue,std::default_delete<duckdb::EvictionQueue>,true>,std::allocator<duckdb::unique_ptr<duckdb::EvictionQueue,std::default_delete<duckdb::EvictionQueue>,true>>>
                    *)&this->queues,
                   (unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>
                    *)&local_40);
        _Var1._M_head_impl = local_40._M_head_impl;
        if (local_40._M_head_impl != (EvictionQueue *)0x0) {
          ::std::vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>::
          ~vector(&((local_40._M_head_impl)->purge_nodes).
                   super_vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>
                 );
          duckdb_moodycamel::
          ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
          ::~ConcurrentQueue(&(_Var1._M_head_impl)->q);
          operator_delete(_Var1._M_head_impl);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (pBVar2->eviction_queue_sizes)._M_elems[lVar4]);
    }
    lVar4 = lVar5;
  } while (lVar5 != 3);
  return;
}

Assistant:

BufferPool::BufferPool(idx_t maximum_memory, bool track_eviction_timestamps,
                       idx_t allocator_bulk_deallocation_flush_threshold)
    : eviction_queue_sizes({BLOCK_QUEUE_SIZE, MANAGED_BUFFER_QUEUE_SIZE, TINY_BUFFER_QUEUE_SIZE}),
      maximum_memory(maximum_memory),
      allocator_bulk_deallocation_flush_threshold(allocator_bulk_deallocation_flush_threshold),
      track_eviction_timestamps(track_eviction_timestamps),
      temporary_memory_manager(make_uniq<TemporaryMemoryManager>()) {
	for (uint8_t type_idx = 0; type_idx < FILE_BUFFER_TYPE_COUNT; type_idx++) {
		const auto type = static_cast<FileBufferType>(type_idx + 1);
		const auto &type_queue_size = eviction_queue_sizes[type_idx];
		for (idx_t queue_idx = 0; queue_idx < type_queue_size; queue_idx++) {
			queues.push_back(make_uniq<EvictionQueue>(type));
		}
	}
}